

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall capnp::compiler::NodeTranslator::StructLayout::Group::addVoid(Group *this)

{
  Group *this_local;
  
  addMember(this);
  (**this->parent->parent->_vptr_StructOrGroup)();
  return;
}

Assistant:

void addVoid() override {
      addMember();

      // Make sure that if this is a member of a union which is in turn a member of another union,
      // that we let the outer union know that a field is being added, even though it is a
      // zero-size field. This is important because the union needs to allocate its discriminant
      // just before its second member is added.
      parent.parent.addVoid();
    }